

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O0

REF_STATUS ref_egads_save(REF_GEOM ref_geom,char *filename)

{
  char *filename_local;
  REF_GEOM ref_geom_local;
  
  printf("nothing for %s, No EGADS(full) linked for %s\n","ref_egads_save",filename);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_egads_save(REF_GEOM ref_geom, const char *filename) {
#if defined(HAVE_EGADS) && !defined(HAVE_EGADS_LITE)
  remove(filename); /* ignore failure */
  REIS(EGADS_SUCCESS, EG_saveModel((ego)(ref_geom->model), filename),
       "EG save");
#else
  printf("nothing for %s, No EGADS(full) linked for %s\n", __func__, filename);
  SUPRESS_UNUSED_COMPILER_WARNING(ref_geom);
#endif

  return REF_SUCCESS;
}